

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureAlloc.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::AllocateTexture(GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint8_t uVar1;
  bool bVar2;
  int iVar3;
  GMM_STATUS local_84;
  undefined1 local_80 [4];
  GMM_STATUS Status;
  __GMM_BUFFER_TYPE Restrictions;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  Restrictions._88_8_ = pTexInfo;
  memset(local_80,0,0x60);
  if (Restrictions._88_8_ == 0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else if (this->pGmmLibContext == (Context *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    GetTexRestrictions(this,(GMM_TEXTURE_INFO *)Restrictions._88_8_,(__GMM_BUFFER_TYPE *)local_80);
    this_local._4_4_ =
         __GmmTexFillHAlignVAlign((GMM_TEXTURE_INFO *)Restrictions._88_8_,this->pGmmLibContext);
    if (this_local._4_4_ == GMM_SUCCESS) {
      uVar1 = GmmIsPlanar(*(GMM_RESOURCE_FORMAT *)(Restrictions._88_8_ + 4));
      if (uVar1 == '\0') {
        SetTileMode(this,(GMM_TEXTURE_INFO *)Restrictions._88_8_);
        switch(*(undefined4 *)Restrictions._88_8_) {
        case 1:
          local_84 = (*this->_vptr_GmmTextureCalc[0x11])(this,Restrictions._88_8_,local_80);
          break;
        case 2:
        case 8:
        case 9:
        case 10:
        case 0x12:
        case 0x13:
        case 0x15:
        case 0x18:
        case 0x1d:
          local_84 = (*this->_vptr_GmmTextureCalc[0x12])(this,Restrictions._88_8_,local_80);
          break;
        case 3:
          local_84 = (*this->_vptr_GmmTextureCalc[0x13])(this,Restrictions._88_8_,local_80);
          break;
        case 4:
          local_84 = (*this->_vptr_GmmTextureCalc[0x14])(this,Restrictions._88_8_,local_80);
          break;
        case 5:
        case 6:
        case 0xb:
        case 0xc:
        case 0xd:
        case 0xe:
        case 0xf:
        case 0x10:
        case 0x11:
        case 0x14:
        case 0x16:
        case 0x17:
        case 0x19:
        case 0x1a:
          local_84 = FillTexBlockMem(this,(GMM_TEXTURE_INFO *)Restrictions._88_8_,
                                     (__GMM_BUFFER_TYPE *)local_80);
          break;
        default:
          return GMM_INVALIDPARAM;
        }
        bVar2 = ValidateTexInfo(this,(GMM_TEXTURE_INFO *)Restrictions._88_8_,
                                (__GMM_BUFFER_TYPE *)local_80);
        if (bVar2) {
          iVar3 = (*this->_vptr_GmmTextureCalc[0xe])(this,Restrictions._88_8_,Restrictions._88_8_);
          if (iVar3 == 0) {
            this_local._4_4_ = local_84;
          }
          else {
            this_local._4_4_ = GMM_ERROR;
          }
        }
        else {
          this_local._4_4_ = GMM_ERROR;
        }
      }
      else {
        this_local._4_4_ = (**this->_vptr_GmmTextureCalc)(this,Restrictions._88_8_,local_80);
        if ((this_local._4_4_ != GMM_SUCCESS) ||
           (bVar2 = ValidateTexInfo(this,(GMM_TEXTURE_INFO *)Restrictions._88_8_,
                                    (__GMM_BUFFER_TYPE *)local_80), bVar2)) {
          iVar3 = (*this->_vptr_GmmTextureCalc[0xe])(this,Restrictions._88_8_,Restrictions._88_8_);
          if (iVar3 != 0) {
            this_local._4_4_ = GMM_ERROR;
          }
        }
        else {
          this_local._4_4_ = GMM_ERROR;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::AllocateTexture(GMM_TEXTURE_INFO *pTexInfo)
{
    __GMM_BUFFER_TYPE Restrictions = {0};
    GMM_STATUS        Status;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pGmmLibContext, GMM_ERROR);

    GMM_DPF_ENTER;

    GetTexRestrictions(pTexInfo, &Restrictions);

    if((Status = __GmmTexFillHAlignVAlign(pTexInfo, pGmmLibContext)) != GMM_SUCCESS)
    {
        return Status;
    }

    // Planar YUV resources treated special. Packed YUV treated like 2D/3D/Cube...
    if(GmmIsPlanar(pTexInfo->Format))
    {
        Status = FillTexPlanar(pTexInfo, &Restrictions);

        if((Status == GMM_SUCCESS) &&
           (ValidateTexInfo(pTexInfo, &Restrictions) == false))
        {
            return GMM_ERROR;
        }
        if(GMM_SUCCESS != FillTexCCS(pTexInfo, pTexInfo))
        {
            return GMM_ERROR;
        }
        return Status;
    }
    else
    {
        SetTileMode(pTexInfo);
    }

    switch(pTexInfo->Type)
    {
        case RESOURCE_2D:
        case RESOURCE_PRIMARY:
        case RESOURCE_SHADOW:
        case RESOURCE_STAGING:
        case RESOURCE_GDI:
        case RESOURCE_NNDI:
        case RESOURCE_HARDWARE_MBM:
        case RESOURCE_OVERLAY_INTERMEDIATE_SURFACE:
        case RESOURCE_IFFS_MAPTOGTT:
#if _WIN32
        case RESOURCE_WGBOX_ENCODE_DISPLAY:
        case RESOURCE_WGBOX_ENCODE_REFERENCE:
#endif
        {
            Status = FillTex2D(pTexInfo, &Restrictions);

            break;
        }
        case RESOURCE_1D:
        {
            Status = FillTex1D(pTexInfo, &Restrictions);

            break;
        }
        case RESOURCE_3D:
        {
            Status = FillTex3D(pTexInfo, &Restrictions);

            break;
        }
        case RESOURCE_CUBE:
        {
            Status = FillTexCube(pTexInfo, &Restrictions);

            break;
        }
        case RESOURCE_SCRATCH:
        case RESOURCE_BUFFER:
        case RESOURCE_FBC:
        case RESOURCE_PWR_CONTEXT:
        case RESOURCE_KMD_BUFFER:
        case RESOURCE_NULL_CONTEXT_INDIRECT_STATE:
        case RESOURCE_PERF_DATA_QUEUE:
        case RESOURCE_HW_CONTEXT:
        case RESOURCE_TAG_PAGE:
        case RESOURCE_OVERLAY_DMA:
        case RESOURCE_GTT_TRANSFER_REGION:
        case RESOURCE_GLOBAL_BUFFER:
        case RESOURCE_CURSOR:
        case RESOURCE_GFX_CLIENT_BUFFER:
#if _WIN32
        case RESOURCE_WGBOX_ENCODE_STATE:
        case RESOURCE_WGBOX_ENCODE_TFD:
#endif
        {
            Status = FillTexBlockMem(pTexInfo, &Restrictions);
            break;
        }
        default:
        {
            GMM_ASSERTDPF(0, "GmmTexAlloc: Unknown surface type!");
            return GMM_INVALIDPARAM;
        }
    };

    if(ValidateTexInfo(pTexInfo, &Restrictions) == false)
    {
        return GMM_ERROR;
    }

    if(GMM_SUCCESS != FillTexCCS(pTexInfo, pTexInfo))
    {
        return GMM_ERROR;
    }

    return Status;
}